

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O0

void __thiscall r_exec::_Mem::stop(_Mem *this)

{
  undefined8 uVar1;
  _ReductionJob *j;
  TimeJob *j_00;
  size_type sVar2;
  __int_type_conflict _Var3;
  undefined1 local_68 [8];
  unique_lock<std::mutex> lock;
  uint64_t i;
  allocator local_39;
  string local_38 [39];
  string local_11;
  _Mem *local_10;
  _Mem *this_local;
  
  local_10 = this;
  std::mutex::lock(&this->m_stateMutex);
  if (this->state == RUNNING) {
    lock._M_owns = false;
    lock._9_7_ = 0;
    for (; (ulong)lock._8_8_ < this->reduction_core_count; lock._8_8_ = lock._8_8_ + 1) {
      j = (_ReductionJob *)operator_new(0x18);
      (j->super__Object)._vptr__Object = (_func_int **)0x0;
      (j->super__Object).refCount.super___atomic_base<long>._M_i = 0;
      j->ijt = 0;
      ShutdownReductionCore::ShutdownReductionCore((ShutdownReductionCore *)j);
      pushReductionJob(this,j);
    }
    lock._M_owns = false;
    lock._9_7_ = 0;
    for (; (ulong)lock._8_8_ < this->time_core_count; lock._8_8_ = lock._8_8_ + 1) {
      j_00 = (TimeJob *)operator_new(0x20);
      ShutdownTimeCore::ShutdownTimeCore((ShutdownTimeCore *)j_00);
      pushTimeJob(this,j_00);
    }
    this->state = STOPPED;
    std::mutex::unlock(&this->m_stateMutex);
    lock._M_owns = false;
    lock._9_7_ = 0;
    while( true ) {
      uVar1 = lock._8_8_;
      sVar2 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&this->m_coreThreads);
      if (sVar2 <= (ulong)uVar1) break;
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                (&this->m_coreThreads,lock._8_8_);
      std::thread::join();
      lock._8_8_ = lock._8_8_ + 1;
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_68,&this->m_coreCountMutex);
    while( true ) {
      _Var3 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base *)&this->m_coreCount);
      if (_Var3 == 0) break;
      std::condition_variable::wait((unique_lock *)&this->m_coresRunning);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::clear(&this->m_coreThreads);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"mem",&local_39);
    ::debug(&local_11);
    DebugStream::operator<<((DebugStream *)&local_11,"memory asked to stop while not running");
    DebugStream::~DebugStream((DebugStream *)&local_11);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void _Mem::stop()
{
    m_stateMutex.lock();

    if (state != RUNNING) {
        ::debug("mem") << "memory asked to stop while not running";
        return;
    }

    // We need to do this because things are wait()ing
    uint64_t i;

    for (i = 0; i < reduction_core_count; ++i) {
        pushReductionJob(new ShutdownReductionCore());
    }

    for (i = 0; i < time_core_count; ++i) {
        pushTimeJob(new ShutdownTimeCore());
    }

    state = STOPPED;
    m_stateMutex.unlock();

    for (i = 0; i < m_coreThreads.size(); ++i) {
        m_coreThreads[i].join();
    }

    std::unique_lock<std::mutex> lock(m_coreCountMutex);

    while (m_coreCount > 0) {
        m_coresRunning.wait(lock);
    }

    m_coreThreads.clear();
}